

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyPowerAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::StickyPowerAtomTypesSectionParser::parseLine
          (StickyPowerAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  RealType RVar1;
  int iVar2;
  undefined8 uVar3;
  uint in_ECX;
  RealType in_RDX;
  RealType in_RDI;
  RealType rup_00;
  RealType RVar4;
  StringTokenizer *this_00;
  RealType RVar5;
  StickyAdapter *this_01;
  bool isPower;
  RealType rup;
  RealType rlp;
  RealType ru;
  RealType rl;
  RealType v0p;
  RealType v0;
  RealType w0;
  StickyAdapter sa;
  AtomType *atomType;
  string atomTypeName;
  RealType eus;
  RealType dus;
  int nTokens;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffe20;
  StringTokenizer *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  ForceField *in_stack_fffffffffffffe60;
  undefined1 isPower_00;
  undefined4 in_stack_fffffffffffffeb0;
  StringTokenizer *this_02;
  undefined7 in_stack_fffffffffffffed0;
  StickyAdapter local_f0;
  AtomType *local_e8;
  string local_e0 [32];
  RealType local_c0;
  RealType local_b8;
  int local_b0;
  undefined1 local_99 [125];
  uint local_1c;
  
  this_02 = (StringTokenizer *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
             (allocator<char> *)in_stack_fffffffffffffe50);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  iVar2 = StringTokenizer::countTokens(in_stack_fffffffffffffe30);
  local_b0 = iVar2;
  rup_00 = ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x25b9f7);
  local_b8 = rup_00;
  RVar4 = ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x25ba25);
  local_c0 = RVar4;
  if (local_b0 < 8) {
    snprintf(painCave.errMsg,2000,
             "StickyPowerAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(this_02);
    isPower_00 = (undefined1)((ulong)RVar4 >> 0x38);
    local_e8 = ForceField::getAtomType(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (local_e8 == (AtomType *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffe20 = &painCave;
      snprintf(painCave.errMsg,2000,
               "StickyPowerAtomTypesSectionParser Error: Can not find matching AtomType %s\n",uVar3)
      ;
      in_stack_fffffffffffffe20->isFatal = 1;
      simError();
    }
    else {
      StickyAdapter::StickyAdapter(&local_f0,local_e8);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe60);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe60);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe60);
      this_00 = (StringTokenizer *)
                StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe60);
      StringTokenizer::nextTokenAsDouble(this_00);
      RVar4 = local_b8;
      RVar5 = StringTokenizer::nextTokenAsDouble(this_00);
      RVar1 = local_b8;
      this_01 = (StickyAdapter *)(RVar4 * RVar5);
      RVar4 = StringTokenizer::nextTokenAsDouble(this_00);
      StickyAdapter::makeSticky
                (this_01,RVar1 * RVar4,(RealType)CONCAT17(1,in_stack_fffffffffffffed0),
                 (RealType)this_02,in_RDX,in_RDI,(RealType)CONCAT44(iVar2,in_stack_fffffffffffffeb0)
                 ,rup_00,(bool)isPower_00);
    }
    std::__cxx11::string::~string(local_e0);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void StickyPowerAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens  = tokenizer.countTokens();
    RealType dus = options_.getDistanceUnitScaling();
    RealType eus = options_.getEnergyUnitScaling();

    // in AtomTypeSection, a line at least contains 8 tokens
    // atomTypeName and 7 different sticky parameters
    if (nTokens < 8) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyPowerAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      string atomTypeName = tokenizer.nextToken();
      AtomType* atomType  = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        StickyAdapter sa = StickyAdapter(atomType);

        RealType w0  = tokenizer.nextTokenAsDouble();
        RealType v0  = eus * tokenizer.nextTokenAsDouble();
        RealType v0p = eus * tokenizer.nextTokenAsDouble();
        RealType rl  = dus * tokenizer.nextTokenAsDouble();
        RealType ru  = dus * tokenizer.nextTokenAsDouble();
        RealType rlp = dus * tokenizer.nextTokenAsDouble();
        RealType rup = dus * tokenizer.nextTokenAsDouble();
        bool isPower = true;

        sa.makeSticky(w0, v0, v0p, rl, ru, rlp, rup, isPower);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StickyPowerAtomTypesSectionParser Error: Can not find "
                 "matching AtomType %s\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }